

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 local_480 [8];
  string line;
  ifstream finList;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  cmAlphaNum local_c0;
  string local_80;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string fileList;
  cmCTestCoverageHandler *this_local;
  
  fileList.field_2._8_8_ = this;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_80,(this->super_cmCTestGenericHandler).CTest);
  cmAlphaNum::cmAlphaNum(&local_60,&local_80);
  cmAlphaNum::cmAlphaNum(&local_c0,"/CMakeFiles/TargetDirectories.txt");
  cmStrCat<>((string *)local_30,&local_60,&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  poVar2 = std::operator<<((ostream *)local_238," target directory list [");
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  std::operator<<(poVar2,"]\n");
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x8b3,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_258);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar3,_S_in);
  std::__cxx11::string::string((string *)local_480);
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)(line.field_2._M_local_buf + 8),(string *)local_480,(bool *)0x0,
                       0xffffffffffffffff);
    if (!bVar1) break;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    LoadLabels(this,pcVar3);
  }
  std::__cxx11::string::~string((string *)local_480);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels()
{
  std::string fileList =
    cmStrCat(this->CTest->GetBinaryDir(), "/CMakeFiles/TargetDirectories.txt");
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " target directory list [" << fileList << "]\n",
                     this->Quiet);
  cmsys::ifstream finList(fileList.c_str());
  std::string line;
  while (cmSystemTools::GetLineFromStream(finList, line)) {
    this->LoadLabels(line.c_str());
  }
}